

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::
UnresolvedBase<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::LValue>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (UnresolvedBase<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::LValue>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::JValue>
  *pUVar2;
  LValue *lvalue;
  UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::JValue>
  *this_00;
  undefined1 local_60 [48];
  
  local_60._24_8_ = ZEXT18((byte)this[0x28]);
  local_60._8_8_ = SEXT48((int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 3) * -0x33333333);
  local_60._0_8_ = 0;
  local_60._16_8_ = 0;
  auVar1 = *(undefined1 (*) [16])(this + 0x18);
  local_60._40_4_ = auVar1._0_4_;
  local_60._32_8_ = auVar1._8_8_;
  local_60._44_4_ = auVar1._4_4_;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  pUVar2 = *(UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::JValue>
             **)(this + 8);
  for (this_00 = *(UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::JValue>
                   **)this; this_00 != pUVar2; this_00 = this_00 + 0x28) {
    UnresolvedLValueBase<njoy::ENDFtk::section::Type<2,151>::LJValueType<njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent,void>::JValue>
    ::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->SPI(), this->AP(),
                 this->LSSF(), 0,
                 this->NLS(), 0 ).print( it, MAT, MF, MT );
  for ( const auto& lvalue : this->lValues() ) {

    lvalue.print( it, MAT, MF, MT );
  }
}